

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::VarConvertToNumber_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<1UL> *argAction;
  TTDVar origVar;
  RecyclableObject *this;
  ScriptContext *pSVar2;
  Var result;
  Var res;
  RecyclableObject *__obj;
  Var var;
  JsRTSingleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)29>
                          (evt);
    origVar = GetVarItem_0<1ul>(argAction);
    __obj = (RecyclableObject *)InflateVarInReplay(executeContext,origVar);
    if (__obj != (RecyclableObject *)0x0) {
      bVar1 = Js::VarIs<Js::RecyclableObject>(__obj);
      if (bVar1) {
        this = Js::VarTo<Js::RecyclableObject>(__obj);
        pSVar2 = Js::RecyclableObject::GetScriptContext(this);
        if (pSVar2 != scriptContext) {
          __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,this,false);
        }
      }
      result = Js::JavascriptOperators::ToNumber(__obj,scriptContext);
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)29>
                (executeContext,evt,result);
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void VarConvertToNumber_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::VarConvertToNumberActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(var, ctx);

            Js::Var res = Js::JavascriptOperators::ToNumber(var, ctx);

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::VarConvertToNumberActionTag>(executeContext, evt, res);
        }